

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int imcomp_test_overlap(int ndim,long *tfpixel,long *tlpixel,long *fpixel,long *lpixel,long *ininc,
                       int *status)

{
  long lVar1;
  long local_188;
  long local_180;
  long local_178;
  long local_170;
  long tl;
  long tf;
  int ii;
  long inc [6];
  long tilefpix [6];
  long imglpix [6];
  long imgfpix [6];
  long tiledim [6];
  long imgdim [6];
  long *ininc_local;
  long *lpixel_local;
  long *fpixel_local;
  long *tlpixel_local;
  long *tfpixel_local;
  int ndim_local;
  
  if (*status < 1) {
    for (tf._4_4_ = 0; tf._4_4_ < ndim; tf._4_4_ = tf._4_4_ + 1) {
      if ((tlpixel[tf._4_4_] < fpixel[tf._4_4_]) || (lpixel[tf._4_4_] < tfpixel[tf._4_4_])) {
        return 0;
      }
      inc[(long)tf._4_4_ + -1] = ininc[tf._4_4_];
      lVar1 = inc[(long)tf._4_4_ + -1];
      if (lVar1 < 1) {
        lVar1 = -lVar1;
      }
      tiledim[(long)tf._4_4_ + 5] = (lpixel[tf._4_4_] - fpixel[tf._4_4_]) / lVar1 + 1;
      if (tiledim[(long)tf._4_4_ + 5] < 1) {
        *status = 0x143;
        return 0;
      }
      imgfpix[(long)tf._4_4_ + 5] = (tlpixel[tf._4_4_] - tfpixel[tf._4_4_]) + 1;
      if (imgfpix[(long)tf._4_4_ + 5] < 1) {
        *status = 0x143;
        return 0;
      }
      if (0 < tf._4_4_) {
        imgfpix[(long)tf._4_4_ + 5] =
             imgfpix[(long)(tf._4_4_ + -1) + 5] * imgfpix[(long)tf._4_4_ + 5];
      }
      tl = tfpixel[tf._4_4_] + -1;
      local_170 = tlpixel[tf._4_4_] + -1;
      while( true ) {
        lVar1 = inc[(long)tf._4_4_ + -1];
        if (lVar1 < 1) {
          lVar1 = -lVar1;
        }
        if ((tl - (fpixel[tf._4_4_] + -1)) % lVar1 == 0) break;
        tl = tl + 1;
        if (local_170 < tl) {
          return 0;
        }
      }
      while( true ) {
        lVar1 = inc[(long)tf._4_4_ + -1];
        if (lVar1 < 1) {
          lVar1 = -lVar1;
        }
        if ((local_170 - (fpixel[tf._4_4_] + -1)) % lVar1 == 0) break;
        local_170 = local_170 + -1;
        if (local_170 < tl) {
          return 0;
        }
      }
      lVar1 = inc[(long)tf._4_4_ + -1];
      if (lVar1 < 1) {
        lVar1 = -lVar1;
      }
      if (((tl - fpixel[tf._4_4_]) + 1) / lVar1 < 1) {
        local_178 = 0;
      }
      else {
        local_178 = inc[(long)tf._4_4_ + -1];
        if (local_178 < 1) {
          local_178 = -local_178;
        }
        local_178 = ((tl - fpixel[tf._4_4_]) + 1) / local_178;
      }
      imglpix[(long)tf._4_4_ + 5] = local_178;
      lVar1 = inc[(long)tf._4_4_ + -1];
      if (lVar1 < 1) {
        lVar1 = -lVar1;
      }
      if (((local_170 - fpixel[tf._4_4_]) + 1) / lVar1 < tiledim[(long)tf._4_4_ + 5] + -1) {
        local_180 = inc[(long)tf._4_4_ + -1];
        if (local_180 < 1) {
          local_180 = -local_180;
        }
        local_180 = ((local_170 - fpixel[tf._4_4_]) + 1) / local_180;
      }
      else {
        local_180 = tiledim[(long)tf._4_4_ + 5] + -1;
      }
      tilefpix[(long)tf._4_4_ + 5] = local_180;
      if (fpixel[tf._4_4_] - tfpixel[tf._4_4_] < 1) {
        local_188 = 0;
      }
      else {
        local_188 = fpixel[tf._4_4_] - tfpixel[tf._4_4_];
      }
      inc[(long)tf._4_4_ + 5] = local_188;
      while( true ) {
        lVar1 = inc[(long)tf._4_4_ + -1];
        if (lVar1 < 1) {
          lVar1 = -lVar1;
        }
        if (((tfpixel[tf._4_4_] + inc[(long)tf._4_4_ + 5]) - fpixel[tf._4_4_]) % lVar1 == 0) break;
        inc[(long)tf._4_4_ + 5] = inc[(long)tf._4_4_ + 5] + 1;
        if (imgfpix[(long)tf._4_4_ + 5] <= inc[(long)tf._4_4_ + 5]) {
          return 0;
        }
      }
      if (0 < tf._4_4_) {
        tiledim[(long)tf._4_4_ + 5] =
             tiledim[(long)(tf._4_4_ + -1) + 5] * tiledim[(long)tf._4_4_ + 5];
      }
    }
    tfpixel_local._4_4_ = 1;
  }
  else {
    tfpixel_local._4_4_ = *status;
  }
  return tfpixel_local._4_4_;
}

Assistant:

int imcomp_test_overlap (
    int ndim,           /* I - number of dimension in the tile and image */
    long *tfpixel,      /* I - first pixel number in each dim. of the tile */
    long *tlpixel,      /* I - last pixel number in each dim. of the tile */
    long *fpixel,       /* I - first pixel number in each dim. of the image */
    long *lpixel,       /* I - last pixel number in each dim. of the image */
    long *ininc,        /* I - increment to be applied in each image dimen. */
    int *status)

/* 
  test if there are any intersecting pixels between this tile and the section
  of the image defined by fixel, lpixel, ininc. 
*/
{
    long imgdim[MAX_COMPRESS_DIM]; /* product of preceding dimensions in the */
                                   /* output image, allowing for inc factor */
    long tiledim[MAX_COMPRESS_DIM]; /* product of preceding dimensions in the */
                                 /* tile, array;  inc factor is not relevant */
    long imgfpix[MAX_COMPRESS_DIM]; /* 1st img pix overlapping tile: 0 base, */
                                    /*  allowing for inc factor */
    long imglpix[MAX_COMPRESS_DIM]; /* last img pix overlapping tile 0 base, */
                                    /*  allowing for inc factor */
    long tilefpix[MAX_COMPRESS_DIM]; /* 1st tile pix overlapping img 0 base, */
                                    /*  allowing for inc factor */
    long inc[MAX_COMPRESS_DIM]; /* local copy of input ininc */
    int ii;
    long tf, tl;

    if (*status > 0)
        return(*status);


    /* ------------------------------------------------------------ */
    /* calc amount of overlap in each dimension; if there is zero   */
    /* overlap in any dimension then just return  */
    /* ------------------------------------------------------------ */
    
    for (ii = 0; ii < ndim; ii++)
    {
        if (tlpixel[ii] < fpixel[ii] || tfpixel[ii] > lpixel[ii])
            return(0);  /* there are no overlapping pixels */

        inc[ii] = ininc[ii];

        /* calc dimensions of the output image section */
        imgdim[ii] = (lpixel[ii] - fpixel[ii]) / labs(inc[ii]) + 1;
        if (imgdim[ii] < 1) {
            *status = NEG_AXIS;
            return(0);
        }

        /* calc dimensions of the tile */
        tiledim[ii] = tlpixel[ii] - tfpixel[ii] + 1;
        if (tiledim[ii] < 1) {
            *status = NEG_AXIS;
            return(0);
        }

        if (ii > 0)
           tiledim[ii] *= tiledim[ii - 1];  /* product of dimensions */

        /* first and last pixels in image that overlap with the tile, 0 base */
        tf = tfpixel[ii] - 1;
        tl = tlpixel[ii] - 1;

        /* skip this plane if it falls in the cracks of the subsampled image */
        while ((tf-(fpixel[ii] - 1)) % labs(inc[ii]))
        {
           tf++;
           if (tf > tl)
             return(0);  /* no overlapping pixels */
        }

        while ((tl-(fpixel[ii] - 1)) % labs(inc[ii]))
        {
           tl--;
           if (tf > tl)
             return(0);  /* no overlapping pixels */
        }
        imgfpix[ii] = maxvalue((tf - fpixel[ii] +1) / labs(inc[ii]) , 0);
        imglpix[ii] = minvalue((tl - fpixel[ii] +1) / labs(inc[ii]) ,
                               imgdim[ii] - 1);

        /* first pixel in the tile that overlaps with the image (0 base) */
        tilefpix[ii] = maxvalue(fpixel[ii] - tfpixel[ii], 0);

        while ((tfpixel[ii] + tilefpix[ii] - fpixel[ii]) % labs(inc[ii]))
        {
           (tilefpix[ii])++;
           if (tilefpix[ii] >= tiledim[ii])
              return(0);  /* no overlapping pixels */
        }

        if (ii > 0)
           imgdim[ii] *= imgdim[ii - 1];  /* product of dimensions */
    }

    return(1);  /* there appears to be  intersecting pixels */
}